

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O2

symbol * dmrC_evaluate_statement(dmr_C *C,statement *stmt)

{
  char cVar1;
  statement_list *psVar2;
  ident *piVar3;
  int iVar4;
  long lVar5;
  statement *stmt_00;
  expression *peVar6;
  symbol *psVar7;
  void *pvVar8;
  char *pcVar9;
  symbol *psVar10;
  ulong uVar11;
  allocator *ident;
  expression **enumcase;
  int iVar12;
  expression *local_58;
  ptr_list_iter local_50;
  ulong local_38;
  
  uVar11 = 0;
LAB_0010c437:
  for (; psVar7 = (symbol *)0x0, stmt != (statement *)0x0;
      stmt = *(statement **)((long)&stmt->type + lVar5)) {
    local_38 = uVar11;
    switch(stmt->type) {
    case STMT_DECLARATION:
      ptrlist_forward_iterator(&local_50,(ptr_list *)(stmt->field_2).field_1.expression);
      while (psVar7 = (symbol *)ptrlist_iter_next(&local_50), psVar7 != (symbol *)0x0) {
        evaluate_symbol(C,psVar7);
      }
LAB_0010c7d7:
      psVar7 = (symbol *)0x0;
      goto switchD_0010c456_default;
    case STMT_EXPRESSION:
      psVar7 = dmrC_evaluate_expression(C,(stmt->field_2).field_1.expression);
      if (psVar7 == (symbol *)0x0) goto LAB_0010c7d7;
      peVar6 = (stmt->field_2).field_1.expression;
      if (peVar6->ctype == &C->S->null_ctype) {
        peVar6 = cast_to(C,peVar6,&C->S->ptr_ctype);
        (stmt->field_2).field_1.expression = peVar6;
      }
      psVar7 = degenerate(C,peVar6);
      goto switchD_0010c456_default;
    case STMT_COMPOUND:
      evaluate_symbol(C,(stmt->field_2).field_2.ret_target);
      psVar7 = dmrC_evaluate_statement(C,(stmt->field_2).field_4.args);
      ptrlist_forward_iterator(&local_50,(ptr_list *)(stmt->field_2).field_1.expression);
      while (stmt_00 = (statement *)ptrlist_iter_next(&local_50), stmt_00 != (statement *)0x0) {
        psVar7 = dmrC_evaluate_statement(C,stmt_00);
      }
      if (psVar7 == (symbol *)0x0) {
        psVar7 = &C->S->void_ctype;
      }
      goto switchD_0010c456_default;
    case STMT_IF:
      peVar6 = (stmt->field_2).field_1.expression;
      psVar7 = (symbol *)0x0;
      if (peVar6 == (expression *)0x0) goto switchD_0010c456_default;
      evaluate_conditional(C,peVar6,0);
      dmrC_evaluate_statement(C,(stmt->field_2).field_3.if_true);
      break;
    case STMT_RETURN:
      peVar6 = (stmt->field_2).field_1.expression;
      dmrC_evaluate_expression(C,peVar6);
      psVar7 = (C->current_fn->field_14).field_2.ctype.base_type;
      if ((psVar7 == (symbol *)0x0) || (psVar7 == &C->S->void_ctype)) {
        if (peVar6 != (expression *)0x0) {
          if (peVar6->ctype != &C->S->void_ctype) {
            pcVar9 = "void";
            if (psVar7 == (symbol *)0x0) {
              pcVar9 = "typeless";
            }
            dmrC_expression_error(C,peVar6,"return expression in %s function",pcVar9);
          }
          if (C->Wreturn_void != 0) {
            dmrC_warning(C,stmt->pos,"returning void-valued expression");
          }
        }
      }
      else if (peVar6 == (expression *)0x0) {
        dmrC_sparse_error(C,stmt->pos,"return with no return value");
      }
      else if (peVar6->ctype != (symbol *)0x0) {
        compatible_assignment_types
                  (C,peVar6,psVar7,(expression **)&(stmt->field_2).field_0,"return expression");
      }
      goto LAB_0010c642;
    case STMT_CASE:
      dmrC_evaluate_expression(C,(stmt->field_2).field_1.expression);
      dmrC_evaluate_expression(C,(stmt->field_2).field_1.context);
      break;
    case STMT_SWITCH:
      local_58 = (expression *)0x0;
      peVar6 = (stmt->field_2).field_1.expression;
      dmrC_evaluate_expression(C,peVar6);
      dmrC_evaluate_statement(C,(stmt->field_2).field_3.if_true);
      if (peVar6 != (expression *)0x0) {
        if (peVar6->ctype == (symbol *)0x0) {
          enumcase = &local_58;
        }
        else {
          iVar4 = dmrC_is_enum_type(peVar6->ctype);
          enumcase = &local_58;
          if (iVar4 != 0) {
            enumcase = (expression **)0x0;
          }
        }
        ptrlist_forward_iterator
                  (&local_50,(ptr_list *)((stmt->field_2).field_10.asm_clobbers)->list_[0xf]);
        while (pvVar8 = ptrlist_iter_next(&local_50), pvVar8 != (void *)0x0) {
          lVar5 = *(long *)((long)pvVar8 + 0x90);
          check_case_type(C,peVar6,*(expression **)(lVar5 + 0x10),enumcase);
          check_case_type(C,peVar6,*(expression **)(lVar5 + 0x18),enumcase);
        }
      }
      goto LAB_0010ca6e;
    case STMT_ITERATOR:
      dmrC_evaluate_symbol_list(C,(stmt->field_2).field_8.iterator_syms);
      evaluate_conditional(C,(stmt->field_2).field_8.iterator_pre_condition,1);
      evaluate_conditional(C,(stmt->field_2).field_8.iterator_post_condition,1);
      dmrC_evaluate_statement(C,(stmt->field_2).field_4.args);
      dmrC_evaluate_statement(C,(stmt->field_2).field_8.iterator_statement);
      lVar5 = 0x40;
      goto LAB_0010c4ed;
    case STMT_LABEL:
      goto switchD_0010c456_caseD_9;
    case STMT_GOTO:
      psVar2 = (stmt->field_2).field_4.stmts;
      if ((psVar2 != (statement_list *)0x0) && (psVar2->list_[0xe] == (statement *)0x0)) {
        ident = psVar2->allocator_;
        if ((ident->size_ & 0x400) != 0) {
          psVar7 = dmrC_lookup_symbol((ident *)ident,NS_KEYWORD);
          if (psVar7 != (symbol *)0x0) goto LAB_0010c633;
          ident = psVar2->allocator_;
        }
        pcVar9 = dmrC_show_ident(C,(ident *)ident);
        dmrC_sparse_error(C,stmt->pos,"label \'%s\' was not declared",pcVar9);
      }
LAB_0010c633:
      dmrC_evaluate_expression(C,(stmt->field_2).field_1.context);
LAB_0010c642:
      psVar7 = (symbol *)0x0;
      goto switchD_0010c456_default;
    case STMT_ASM:
      peVar6 = (stmt->field_2).field_1.expression;
      if ((peVar6 == (expression *)0x0) || (*(char *)peVar6 != '\x02')) {
        dmrC_sparse_error(C,stmt->pos,"need constant string for inline asm");
        goto LAB_0010ca6e;
      }
      ptrlist_forward_iterator(&local_50,(ptr_list *)(stmt->field_2).field_1.context);
      peVar6 = (expression *)ptrlist_iter_next(&local_50);
      iVar4 = 0;
      goto LAB_0010c6d4;
    case STMT_CONTEXT:
      dmrC_evaluate_expression(C,(stmt->field_2).field_1.expression);
      goto LAB_0010c7f4;
    case STMT_RANGE:
      dmrC_evaluate_expression(C,(stmt->field_2).field_1.expression);
      dmrC_evaluate_expression(C,(stmt->field_2).field_1.context);
      dmrC_evaluate_expression(C,(stmt->field_2).field_11.range_high);
LAB_0010c7f4:
      psVar7 = (symbol *)0x0;
    default:
      goto switchD_0010c456_default;
    }
    lVar5 = 0x20;
LAB_0010c4ed:
    uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
  }
  goto switchD_0010c456_default;
LAB_0010c6d4:
  if (peVar6 == (expression *)0x0) goto LAB_0010c8e9;
  iVar12 = 1;
  if (iVar4 != 0) {
    if (iVar4 == 2) {
      psVar7 = dmrC_evaluate_expression(C,peVar6);
      if (psVar7 == (symbol *)0x0) goto LAB_0010ca6e;
      if ((*(char *)peVar6 != '\t') || (peVar6->op != 0x2a)) {
        dmrC_warning(C,peVar6->pos,"asm output is not an lvalue");
      }
      evaluate_assign_to(C,peVar6,peVar6->ctype);
      iVar12 = 0;
    }
    else if (*(char *)peVar6 == '\x02') {
      cVar1 = *(char *)((long)&((peVar6->field_5).field_4.symbol_name)->next + 4);
      iVar12 = 2;
      if ((cVar1 != '+') && (cVar1 != '=')) {
        dmrC_expression_error(C,peVar6,"output constraint is not an assignment constraint (\"%s\")")
        ;
      }
    }
    else {
      dmrC_sparse_error(C,peVar6->pos,"asm output constraint is not a string");
      (local_50.__list)->list_[local_50.__nr] = (void *)0x0;
      iVar12 = 2;
    }
  }
  iVar4 = iVar12;
  peVar6 = (expression *)ptrlist_iter_next(&local_50);
  goto LAB_0010c6d4;
switchD_0010c456_caseD_9:
  stmt = (stmt->field_2).field_3.if_true;
  goto LAB_0010c437;
LAB_0010c8e9:
  ptrlist_forward_iterator(&local_50,(ptr_list *)(stmt->field_2).field_3.if_false);
  peVar6 = (expression *)ptrlist_iter_next(&local_50);
  iVar4 = 0;
  while (peVar6 != (expression *)0x0) {
    iVar12 = 1;
    if (iVar4 != 0) {
      if (iVar4 == 2) {
        psVar7 = dmrC_evaluate_expression(C,peVar6);
        iVar12 = 0;
        if (psVar7 == (symbol *)0x0) goto LAB_0010ca6e;
      }
      else {
        if (*(char *)peVar6 == '\x02') {
          piVar3 = (peVar6->field_5).field_4.symbol_name;
          cVar1 = *(char *)((long)&piVar3->next + 4);
          if ((cVar1 != '=') && (iVar12 = 2, cVar1 != '+')) goto LAB_0010c990;
          dmrC_expression_error
                    (C,peVar6,"input constraint with assignment (\"%s\")",
                     (undefined1 *)((long)&piVar3->next + 4));
        }
        else {
          dmrC_sparse_error(C,peVar6->pos,"asm input constraint is not a string");
          (local_50.__list)->list_[local_50.__nr] = (void *)0x0;
        }
        iVar12 = 2;
      }
    }
LAB_0010c990:
    iVar4 = iVar12;
    peVar6 = (expression *)ptrlist_iter_next(&local_50);
  }
  ptrlist_forward_iterator(&local_50,(ptr_list *)(stmt->field_2).field_4.args);
  while (peVar6 = (expression *)ptrlist_iter_next(&local_50), peVar6 != (expression *)0x0) {
    if (*(char *)peVar6 != '\x02') {
      dmrC_expression_error(C,peVar6,"asm clobber is not a string");
    }
  }
  ptrlist_forward_iterator(&local_50,(ptr_list *)(stmt->field_2).field_8.iterator_pre_condition);
  do {
    pcVar9 = (char *)ptrlist_iter_next(&local_50);
    if (pcVar9 == (char *)0x0) goto LAB_0010ca6e;
  } while (*pcVar9 == '\x0e');
  dmrC_sparse_error(C,stmt->pos,"bad asm label");
LAB_0010ca6e:
  uVar11 = local_38;
  psVar7 = (symbol *)0x0;
switchD_0010c456_default:
  psVar10 = (symbol *)0x0;
  if ((uVar11 & 1) == 0) {
    psVar10 = psVar7;
  }
  return psVar10;
}

Assistant:

struct symbol *dmrC_evaluate_statement(struct dmr_C *C, struct statement *stmt)
{
	if (!stmt)
		return NULL;

	switch (stmt->type) {
	case STMT_DECLARATION: {
		struct symbol *s;
		FOR_EACH_PTR(stmt->declaration, s) {
			evaluate_symbol(C, s);
		} END_FOR_EACH_PTR(s);
		return NULL;
	}

	case STMT_RETURN:
		return evaluate_return_expression(C, stmt);

	case STMT_EXPRESSION:
		if (!dmrC_evaluate_expression(C, stmt->expression))
			return NULL;
		if (stmt->expression->ctype == &C->S->null_ctype)
			stmt->expression = cast_to(C, stmt->expression, &C->S->ptr_ctype);
		return degenerate(C, stmt->expression);

	case STMT_COMPOUND: {
		struct statement *s;
		struct symbol *type = NULL;

		/* Evaluate the return symbol in the compound statement */
		evaluate_symbol(C, stmt->ret);

		/*
		 * Then, evaluate each statement, making the type of the
		 * compound statement be the type of the last statement
		 */
		type = dmrC_evaluate_statement(C, stmt->args);
		FOR_EACH_PTR(stmt->stmts, s) {
			type = dmrC_evaluate_statement(C, s);
		} END_FOR_EACH_PTR(s);
		if (!type)
			type = &C->S->void_ctype;
		return type;
	}
	case STMT_IF:
		evaluate_if_statement(C, stmt);
		return NULL;
	case STMT_ITERATOR:
		evaluate_iterator(C, stmt);
		return NULL;
	case STMT_SWITCH:
		evaluate_switch_statement(C, stmt);
		return NULL;
	case STMT_CASE:
		evaluate_case_statement(C, stmt);
		return NULL;
	case STMT_LABEL:
		return dmrC_evaluate_statement(C, stmt->label_statement);
	case STMT_GOTO:
		evaluate_goto_statement(C, stmt);
		return NULL;
	case STMT_NONE:
		break;
	case STMT_ASM:
		evaluate_asm_statement(C, stmt);
		return NULL;
	case STMT_CONTEXT:
		dmrC_evaluate_expression(C, stmt->expression);
		return NULL;
	case STMT_RANGE:
		dmrC_evaluate_expression(C, stmt->range_expression);
		dmrC_evaluate_expression(C, stmt->range_low);
		dmrC_evaluate_expression(C, stmt->range_high);
		return NULL;
	}
	return NULL;
}